

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaParams.cpp
# Opt level: O2

char * __thiscall NaParams::GetParam(NaParams *this,char *szParamName)

{
  void *pvVar1;
  char *pcVar2;
  char szNotFound [11];
  item_t it;
  
  it.value = (char *)0x0;
  builtin_strncpy(szNotFound,"?not found",0xb);
  it.name = szParamName;
  pvVar1 = bsearch(&it,this->storage,(long)this->stored_n,0x10,stored_cmp);
  if (pvVar1 == (void *)0x0) {
    pcVar2 = szNotFound;
  }
  else {
    pcVar2 = *(char **)((long)pvVar1 + 8);
  }
  NaPrintLog("Query for parameter \'%s\' gives value \'%s\'\n",szParamName,pcVar2);
  return pcVar2;
}

Assistant:

char*
NaParams::GetParam (const char* szParamName) const
{
  item_t	it, *pit;
  it.name = (char*)szParamName;
  it.value = NULL;

  char	szNotFound[] = "?not found";
  char	*szParamValue = szNotFound;

  pit = (item_t*)bsearch(&it, storage, stored_n, sizeof(item_t), stored_cmp);
  if(NULL != pit)
    szParamValue = pit->value;

  NaPrintLog("Query for parameter '%s' gives value '%s'\n",
	     szParamName, szParamValue);

  return szParamValue;
}